

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::parsing::testWriterFail<avro::parsing::ValidatingCodecFactory>(TestData2 *td)

{
  bool bVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *e;
  basic_wrap_stringstream<char> *writerCalls;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  Exception *ex;
  auto_ptr<avro::OutputStream> p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  ValidSchema vs;
  char (*in_stack_fffffffffffffc78) [18];
  undefined1 pv_;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffc80;
  std_string *in_stack_fffffffffffffc88;
  basic_cstring<const_char> *in_stack_fffffffffffffc90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffca0;
  basic_cstring<const_char> local_2a0;
  lazy_ostream local_290 [2];
  assertion_result local_270;
  basic_cstring<const_char> local_248 [2];
  char *in_stack_fffffffffffffe58;
  basic_cstring<const_char> local_20 [2];
  
  testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo =
       testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo + 1;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
             ,0x6d);
  memset((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe38,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffc80);
  boost::basic_wrap_stringstream<char>::ref
            ((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe38);
  boost::operator<<(in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78);
  this = boost::operator<<(in_stack_fffffffffffffc80,(int *)in_stack_fffffffffffffc78);
  file = boost::operator<<(in_stack_fffffffffffffc80,*in_stack_fffffffffffffc78);
  line_num = boost::operator<<(in_stack_fffffffffffffc80,(char (*) [10])in_stack_fffffffffffffc78);
  msg = boost::operator<<(in_stack_fffffffffffffc80,(char **)in_stack_fffffffffffffc78);
  e = boost::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  writerCalls = boost::operator<<(in_stack_fffffffffffffc80,(char **)in_stack_fffffffffffffc78);
  v_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffffca0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffffc80);
  makeValidSchema(in_stack_fffffffffffffe58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x25384b);
  std::auto_ptr<avro::OutputStream>::auto_ptr
            ((auto_ptr<avro::OutputStream> *)&stack0xfffffffffffffdf8,(element_type *)0x0);
  do {
    pvVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffde8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    ValidatingEncoderFactory::newEncoder((ValidSchema *)msg);
    testEncoder((EncoderPtr *)e,(char *)writerCalls,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_00,(auto_ptr<avro::OutputStream> *)pvVar2);
    boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x253902);
    do {
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffc78 >> 0x38);
      pvVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (local_248,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc80,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc88,(char (*) [44])in_stack_fffffffffffffc80)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                 ,0x6d);
      in_stack_fffffffffffffc78 = (char (*) [18])0x0;
      boost::test_tools::tt_detail::report_assertion(&local_270,local_290,&local_2a0,0x2ef,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>
                          *)0x2539e9);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x2539f6);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::auto_ptr<avro::OutputStream>::~auto_ptr
            ((auto_ptr<avro::OutputStream> *)in_stack_fffffffffffffc80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar2);
  ValidSchema::~ValidSchema((ValidSchema *)0x253c21);
  return;
}

Assistant:

void testWriterFail(const TestData2& td) {
    static int testNo = 0;
    testNo++;
    BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
        << " schema: " << td.schema
        << " incorrectCalls: " << td.incorrectCalls);
    ValidSchema vs = makeValidSchema(td.schema);

    vector<string> v;
    auto_ptr<OutputStream> p;
    BOOST_CHECK_THROW(testEncoder(CodecFactory::newEncoder(vs),
        td.incorrectCalls, v, p), Exception);
}